

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O0

bool __thiscall Am_Inter_Location::operator&&(Am_Inter_Location *this,Am_Inter_Location *test)

{
  bool local_49;
  int local_3c;
  int local_38;
  int bottom;
  int right;
  int top;
  int left;
  int iStack_24;
  bool test_as_line;
  int test_bottom;
  int test_right;
  int test_top;
  int test_left;
  Am_Inter_Location *test_local;
  Am_Inter_Location *this_local;
  
  _test_top = test;
  test_local = this;
  Get_Points(test,&test_right,&test_bottom,&stack0xffffffffffffffdc,&left);
  Get_As_Line(_test_top,(bool *)((long)&top + 3));
  if ((top._3_1_ & 1) == 0) {
    iStack_24 = test_right + iStack_24;
    left = test_bottom + left;
  }
  else {
    isort(test_right,iStack_24,&test_right,&stack0xffffffffffffffdc);
    isort(test_bottom,left,&test_bottom,&left);
  }
  right = (this->data->data).rect.left;
  bottom = (this->data->data).rect.top;
  local_38 = (this->data->data).rect.width;
  local_3c = (this->data->data).rect.height;
  if ((this->data->as_line & 1U) == 0) {
    local_38 = right + local_38;
    local_3c = bottom + local_3c;
  }
  else {
    isort(right,local_38,&right,&local_38);
    isort(bottom,local_3c,&bottom,&local_3c);
  }
  local_49 = false;
  if (((right < iStack_24) && (local_49 = false, test_right <= local_38)) &&
     (local_49 = false, bottom < left)) {
    local_49 = test_bottom <= local_3c;
  }
  return local_49;
}

Assistant:

bool
Am_Inter_Location::operator&&(const Am_Inter_Location &test) const
{
  int test_left, test_top, test_right, test_bottom;
  test.Get_Points(test_left, test_top, test_right, test_bottom);
  bool test_as_line;
  test.Get_As_Line(test_as_line);
  if (test_as_line) {
    isort(test_left, test_right, test_left, test_right);
    isort(test_top, test_bottom, test_top, test_bottom);
  } else {
    test_right += test_left;
    test_bottom += test_top;
  }
  int left, top, right, bottom;
  left = data->data.line.x1;
  top = data->data.line.y1;
  right = data->data.line.x2;
  bottom = data->data.line.y2;
  if (data->as_line) {
    isort(left, right, left, right);
    isort(top, bottom, top, bottom);
  } else {
    right += left;
    bottom += top;
  }
  return (left < test_right) && (right >= test_left) && (top < test_bottom) &&
         (bottom >= test_top);
}